

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

ExprList * sqlite3ExprListDup(sqlite3 *db,ExprList *p,int flags)

{
  int iVar1;
  Expr *pEVar2;
  Expr *pEVar3;
  char *pcVar4;
  Expr *pNewExpr;
  Expr *pOldExpr;
  Expr *pPriorSelectCol;
  ExprList_item *pEStack_40;
  int i;
  ExprList_item *pOldItem;
  ExprList_item *pItem;
  ExprList *pNew;
  int flags_local;
  ExprList *p_local;
  sqlite3 *db_local;
  
  pOldExpr = (Expr *)0x0;
  if (p == (ExprList *)0x0) {
    db_local = (sqlite3 *)0x0;
  }
  else {
    db_local = (sqlite3 *)sqlite3DbMallocRawNN(db,(long)(p->nExpr + -1) * 0x20 + 0x28);
    if (db_local == (sqlite3 *)0x0) {
      db_local = (sqlite3 *)0x0;
    }
    else {
      iVar1 = p->nExpr;
      *(int *)&db_local->pVfs = iVar1;
      *(int *)((long)&db_local->pVfs + 4) = iVar1;
      pOldItem = (ExprList_item *)&db_local->pVdbe;
      pEStack_40 = p->a;
      for (pPriorSelectCol._4_4_ = 0; pPriorSelectCol._4_4_ < p->nExpr;
          pPriorSelectCol._4_4_ = pPriorSelectCol._4_4_ + 1) {
        pEVar2 = pEStack_40->pExpr;
        pEVar3 = sqlite3ExprDup(db,pEVar2,flags);
        pOldItem->pExpr = pEVar3;
        if (((pEVar2 != (Expr *)0x0) && (pEVar2->op == 0x9f)) &&
           (pEVar2 = pOldItem->pExpr, pEVar2 != (Expr *)0x0)) {
          if (pEVar2->iColumn == 0) {
            pOldExpr = pEVar2->pRight;
            pEVar2->pLeft = pOldExpr;
          }
          else {
            pEVar2->pLeft = pOldExpr;
          }
        }
        pcVar4 = sqlite3DbStrDup(db,pEStack_40->zName);
        pOldItem->zName = pcVar4;
        pcVar4 = sqlite3DbStrDup(db,pEStack_40->zSpan);
        pOldItem->zSpan = pcVar4;
        pOldItem->sortOrder = pEStack_40->sortOrder;
        pOldItem->field_0x19 = pOldItem->field_0x19 & 0xfe;
        pOldItem->field_0x19 =
             pOldItem->field_0x19 & 0xfd | ((byte)pEStack_40->field_0x19 >> 1 & 1) << 1;
        pOldItem->u = pEStack_40->u;
        pOldItem = pOldItem + 1;
        pEStack_40 = pEStack_40 + 1;
      }
    }
  }
  return (ExprList *)db_local;
}

Assistant:

SQLITE_PRIVATE ExprList *sqlite3ExprListDup(sqlite3 *db, ExprList *p, int flags){
  ExprList *pNew;
  struct ExprList_item *pItem, *pOldItem;
  int i;
  Expr *pPriorSelectCol = 0;
  assert( db!=0 );
  if( p==0 ) return 0;
  pNew = sqlite3DbMallocRawNN(db, 
             sizeof(*pNew)+sizeof(pNew->a[0])*(p->nExpr-1) );
  if( pNew==0 ) return 0;
  pNew->nAlloc = pNew->nExpr = p->nExpr;
  pItem = pNew->a;
  pOldItem = p->a;
  for(i=0; i<p->nExpr; i++, pItem++, pOldItem++){
    Expr *pOldExpr = pOldItem->pExpr;
    Expr *pNewExpr;
    pItem->pExpr = sqlite3ExprDup(db, pOldExpr, flags);
    if( pOldExpr 
     && pOldExpr->op==TK_SELECT_COLUMN
     && (pNewExpr = pItem->pExpr)!=0 
    ){
      assert( pNewExpr->iColumn==0 || i>0 );
      if( pNewExpr->iColumn==0 ){
        assert( pOldExpr->pLeft==pOldExpr->pRight );
        pPriorSelectCol = pNewExpr->pLeft = pNewExpr->pRight;
      }else{
        assert( i>0 );
        assert( pItem[-1].pExpr!=0 );
        assert( pNewExpr->iColumn==pItem[-1].pExpr->iColumn+1 );
        assert( pPriorSelectCol==pItem[-1].pExpr->pLeft );
        pNewExpr->pLeft = pPriorSelectCol;
      }
    }
    pItem->zName = sqlite3DbStrDup(db, pOldItem->zName);
    pItem->zSpan = sqlite3DbStrDup(db, pOldItem->zSpan);
    pItem->sortOrder = pOldItem->sortOrder;
    pItem->done = 0;
    pItem->bSpanIsTab = pOldItem->bSpanIsTab;
    pItem->u = pOldItem->u;
  }
  return pNew;
}